

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prog.cc
# Opt level: O0

void __thiscall re2::Prog::Optimize(Prog *this)

{
  int iVar1;
  InstOp IVar2;
  int iVar3;
  iterator piVar4;
  Inst *pIVar5;
  Inst *this_00;
  bool bVar6;
  Inst *in_stack_00000030;
  Prog *in_stack_00000038;
  Inst *k;
  Inst *j_1;
  Inst *ip_1;
  int id_1;
  iterator i_1;
  Inst *jp;
  int j;
  Inst *ip;
  int id;
  iterator i;
  Workq q;
  int in_stack_fffffffffffffe8c;
  int in_stack_fffffffffffffe90;
  int in_stack_fffffffffffffe94;
  InstOp in_stack_fffffffffffffe9c;
  int in_stack_fffffffffffffea0;
  int in_stack_fffffffffffffea4;
  int in_stack_fffffffffffffeac;
  SparseSetT<void> *in_stack_fffffffffffffeb0;
  int *local_70;
  Inst *local_68;
  int local_5c;
  iterator local_48;
  SparseSetT<void> local_30;
  
  SparseSetT<void>::SparseSetT(in_stack_fffffffffffffeb0,in_stack_fffffffffffffeac);
  SparseSetT<void>::clear(&local_30);
  AddToQueue((Workq *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
             in_stack_fffffffffffffe8c);
  for (local_48 = SparseSetT<void>::begin((SparseSetT<void> *)0x265cbd);
      piVar4 = SparseSetT<void>::end
                         ((SparseSetT<void> *)
                          CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90)),
      local_48 != piVar4; local_48 = local_48 + 1) {
    pIVar5 = inst((Prog *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                  in_stack_fffffffffffffe8c);
    local_5c = Inst::out(pIVar5);
    while( true ) {
      bVar6 = false;
      if (local_5c != 0) {
        local_68 = inst((Prog *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                        in_stack_fffffffffffffe8c);
        IVar2 = Inst::opcode(local_68);
        bVar6 = IVar2 == kInstNop;
      }
      if (!bVar6) break;
      local_5c = Inst::out(local_68);
    }
    Inst::set_out((Inst *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                  in_stack_fffffffffffffe9c);
    Inst::out(pIVar5);
    AddToQueue((Workq *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
               in_stack_fffffffffffffe8c);
    IVar2 = Inst::opcode(pIVar5);
    if (IVar2 == kInstAlt) {
      local_5c = Inst::out1(pIVar5);
      while( true ) {
        bVar6 = false;
        if (local_5c != 0) {
          local_68 = inst((Prog *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                          in_stack_fffffffffffffe8c);
          IVar2 = Inst::opcode(local_68);
          bVar6 = IVar2 == kInstNop;
        }
        if (!bVar6) break;
        local_5c = Inst::out(local_68);
      }
      (pIVar5->field_1).cap_ = local_5c;
      Inst::out1(pIVar5);
      AddToQueue((Workq *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                 in_stack_fffffffffffffe8c);
    }
  }
  SparseSetT<void>::clear(&local_30);
  AddToQueue((Workq *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
             in_stack_fffffffffffffe8c);
  local_70 = SparseSetT<void>::begin((SparseSetT<void> *)0x265fe9);
  do {
    piVar4 = SparseSetT<void>::end
                       ((SparseSetT<void> *)
                        CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
    if (local_70 == piVar4) {
      SparseSetT<void>::~SparseSetT
                ((SparseSetT<void> *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
      return;
    }
    iVar1 = *local_70;
    pIVar5 = inst((Prog *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                  in_stack_fffffffffffffe8c);
    Inst::out(pIVar5);
    AddToQueue((Workq *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
               in_stack_fffffffffffffe8c);
    IVar2 = Inst::opcode(pIVar5);
    if (IVar2 == kInstAlt) {
      Inst::out1(pIVar5);
      AddToQueue((Workq *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                 in_stack_fffffffffffffe8c);
    }
    IVar2 = Inst::opcode(pIVar5);
    if (IVar2 == kInstAlt) {
      Inst::out(pIVar5);
      this_00 = inst((Prog *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                     in_stack_fffffffffffffe8c);
      Inst::out1(pIVar5);
      pIVar5 = inst((Prog *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                    in_stack_fffffffffffffe8c);
      IVar2 = Inst::opcode(this_00);
      if ((((IVar2 == kInstByteRange) && (iVar3 = Inst::out(this_00), iVar3 == iVar1)) &&
          (in_stack_fffffffffffffea4 = Inst::lo(this_00), in_stack_fffffffffffffea4 == 0)) &&
         (in_stack_fffffffffffffea0 = Inst::hi(this_00), in_stack_fffffffffffffea0 == 0xff)) {
        bVar6 = IsMatch(in_stack_00000038,in_stack_00000030);
        in_stack_fffffffffffffe9c = CONCAT13(bVar6,(int3)in_stack_fffffffffffffe9c);
        if (bVar6) {
          Inst::set_opcode((Inst *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                           in_stack_fffffffffffffe9c);
          goto LAB_002662d4;
        }
      }
      bVar6 = IsMatch(in_stack_00000038,in_stack_00000030);
      in_stack_fffffffffffffe9c =
           CONCAT13((char)(in_stack_fffffffffffffe9c >> 0x18),
                    CONCAT12(bVar6,(short)in_stack_fffffffffffffe9c));
      if (((bVar6) && (IVar2 = Inst::opcode(pIVar5), IVar2 == kInstByteRange)) &&
         ((in_stack_fffffffffffffe94 = Inst::out(pIVar5), in_stack_fffffffffffffe94 == iVar1 &&
          ((in_stack_fffffffffffffe90 = Inst::lo(pIVar5), in_stack_fffffffffffffe90 == 0 &&
           (in_stack_fffffffffffffe8c = Inst::hi(pIVar5), in_stack_fffffffffffffe8c == 0xff)))))) {
        Inst::set_opcode((Inst *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                         in_stack_fffffffffffffe9c);
      }
    }
LAB_002662d4:
    local_70 = local_70 + 1;
  } while( true );
}

Assistant:

void Prog::Optimize() {
  Workq q(size_);

  // Eliminate nops.  Most are taken out during compilation
  // but a few are hard to avoid.
  q.clear();
  AddToQueue(&q, start_);
  for (Workq::iterator i = q.begin(); i != q.end(); ++i) {
    int id = *i;

    Inst* ip = inst(id);
    int j = ip->out();
    Inst* jp;
    while (j != 0 && (jp=inst(j))->opcode() == kInstNop) {
      j = jp->out();
    }
    ip->set_out(j);
    AddToQueue(&q, ip->out());

    if (ip->opcode() == kInstAlt) {
      j = ip->out1();
      while (j != 0 && (jp=inst(j))->opcode() == kInstNop) {
        j = jp->out();
      }
      ip->out1_ = j;
      AddToQueue(&q, ip->out1());
    }
  }

  // Insert kInstAltMatch instructions
  // Look for
  //   ip: Alt -> j | k
  //	  j: ByteRange [00-FF] -> ip
  //    k: Match
  // or the reverse (the above is the greedy one).
  // Rewrite Alt to AltMatch.
  q.clear();
  AddToQueue(&q, start_);
  for (Workq::iterator i = q.begin(); i != q.end(); ++i) {
    int id = *i;
    Inst* ip = inst(id);
    AddToQueue(&q, ip->out());
    if (ip->opcode() == kInstAlt)
      AddToQueue(&q, ip->out1());

    if (ip->opcode() == kInstAlt) {
      Inst* j = inst(ip->out());
      Inst* k = inst(ip->out1());
      if (j->opcode() == kInstByteRange && j->out() == id &&
          j->lo() == 0x00 && j->hi() == 0xFF &&
          IsMatch(this, k)) {
        ip->set_opcode(kInstAltMatch);
        continue;
      }
      if (IsMatch(this, j) &&
          k->opcode() == kInstByteRange && k->out() == id &&
          k->lo() == 0x00 && k->hi() == 0xFF) {
        ip->set_opcode(kInstAltMatch);
      }
    }
  }
}